

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O0

OptionStatus
setLocalOptionValue(HighsLogOptions *report_log_options,string *name,
                   vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *option_records,
                   bool value)

{
  reference ppOVar1;
  undefined8 uVar2;
  undefined1 in_CL;
  string *in_RDX;
  HighsLogOptions *in_RSI;
  HighsLogOptions *in_RDI;
  HighsOptionType type;
  OptionStatus status;
  HighsInt index;
  undefined8 in_stack_ffffffffffffffc8;
  undefined1 value_00;
  undefined4 in_stack_ffffffffffffffd0;
  HighsOptionType HVar3;
  undefined4 in_stack_ffffffffffffffd4;
  int in_stack_ffffffffffffffd8;
  undefined3 in_stack_ffffffffffffffdc;
  OptionStatus local_4;
  
  value_00 = (undefined1)((ulong)in_stack_ffffffffffffffc8 >> 0x38);
  local_4 = getOptionIndex(in_RSI,in_RDX,
                           (vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *)
                           (CONCAT44(CONCAT13(in_CL,in_stack_ffffffffffffffdc),
                                     in_stack_ffffffffffffffd8) & 0x1ffffffffffffff),
                           (HighsInt *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
                          );
  if (local_4 == kOk) {
    ppOVar1 = std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[]
                        ((vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *)in_RDX,
                         (long)in_stack_ffffffffffffffd8);
    HVar3 = (*ppOVar1)->type;
    if (HVar3 == kBool) {
      std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[]
                ((vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *)in_RDX,
                 (long)in_stack_ffffffffffffffd8);
      local_4 = setLocalOptionValue((OptionRecordBool *)CONCAT44(local_4,HVar3),(bool)value_00);
    }
    else {
      uVar2 = std::__cxx11::string::c_str();
      highsLogUser(in_RDI,kError,"setLocalOptionValue: Option \"%s\" cannot be assigned a bool\n",
                   uVar2);
      local_4 = kIllegalValue;
    }
  }
  return local_4;
}

Assistant:

OptionStatus setLocalOptionValue(const HighsLogOptions& report_log_options,
                                 const std::string& name,
                                 std::vector<OptionRecord*>& option_records,
                                 const bool value) {
  HighsInt index;
  //  printf("setLocalOptionValue: \"%s\" with bool %" HIGHSINT_FORMAT "\n",
  //  name.c_str(), value);
  OptionStatus status =
      getOptionIndex(report_log_options, name, option_records, index);
  if (status != OptionStatus::kOk) return status;
  HighsOptionType type = option_records[index]->type;
  if (type != HighsOptionType::kBool) {
    highsLogUser(
        report_log_options, HighsLogType::kError,
        "setLocalOptionValue: Option \"%s\" cannot be assigned a bool\n",
        name.c_str());
    return OptionStatus::kIllegalValue;
  }
  return setLocalOptionValue(((OptionRecordBool*)option_records[index])[0],
                             value);
}